

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O2

_Bool ECDSA_Sign(COSE *pSigner,int index,eckey_t *eckey,int cbitDigest,byte *rgbToSign,
                size_t cbToSign,cose_errback *perr)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  cose_error cVar5;
  mbedtls_md_info_t *md_info;
  uint8_t *buf;
  cn_cbor *cb_value;
  _Bool _Var6;
  cn_cbor *cb;
  size_t __nmemb;
  uint8_t *__ptr;
  mbedtls_md_type_t mStack_240;
  mbedtls_mpi s;
  mbedtls_mpi r;
  cn_cbor_errback cbor_error;
  byte rgbDigest [32];
  mbedtls_entropy_context entropy;
  mbedtls_ctr_drbg_context ctrDrbg;
  
  mbedtls_entropy_init(&entropy);
  mbedtls_ctr_drbg_init(&ctrDrbg);
  mbedtls_ctr_drbg_seed(&ctrDrbg,mbedtls_entropy_func,&entropy,(uchar *)0x0,0);
  mbedtls_mpi_init(&r);
  mbedtls_mpi_init(&s);
  if ((eckey->d).n == 0) {
    if (perr == (cose_errback *)0x0) goto LAB_00180d87;
LAB_00180c96:
    cVar5 = COSE_ERR_INVALID_PARAMETER;
LAB_00180c98:
    buf = (uint8_t *)0x0;
    cb_value = (cn_cbor *)0x0;
LAB_00180c9b:
    perr->err = cVar5;
  }
  else {
    if (cbitDigest == 0x100) {
      mStack_240 = MBEDTLS_MD_SHA256;
LAB_00180c59:
      md_info = mbedtls_md_info_from_type(mStack_240);
      if ((md_info == (mbedtls_md_info_t *)0x0) ||
         (iVar3 = mbedtls_md(md_info,rgbToSign,cbToSign,rgbDigest), iVar3 != 0)) goto LAB_00180c82;
      bVar1 = mbedtls_md_get_size(md_info);
      iVar3 = mbedtls_ecdsa_sign_det_ext
                        (&eckey->grp,&r,&s,&eckey->d,rgbDigest,(ulong)bVar1,mStack_240,
                         mbedtls_ctr_drbg_random,&ctrDrbg);
      if (iVar3 != 0) {
        if (perr == (cose_errback *)0x0) goto LAB_00180d87;
        cVar5 = COSE_ERR_CRYPTO_FAIL;
        goto LAB_00180c98;
      }
      iVar3 = (int)((eckey->grp).nbits + 7 >> 3);
      __nmemb = (size_t)iVar3;
      buf = (uint8_t *)calloc(__nmemb,2);
      if (buf == (uint8_t *)0x0) {
        if (perr != (cose_errback *)0x0) {
          cVar5 = COSE_ERR_OUT_OF_MEMORY;
          goto LAB_00180c98;
        }
        goto LAB_00180d87;
      }
      iVar4 = mbedtls_mpi_write_binary(&r,buf,__nmemb);
      if ((iVar4 != 0) || (iVar4 = mbedtls_mpi_write_binary(&s,buf + __nmemb,__nmemb), iVar4 != 0))
      {
        if (perr != (cose_errback *)0x0) {
          cVar5 = COSE_ERR_INTERNAL;
          goto LAB_00180d68;
        }
LAB_00180e50:
        cb_value = (cn_cbor *)0x0;
        goto LAB_00180d89;
      }
      cb_value = cn_cbor_data_create(buf,iVar3 * 2,&cbor_error);
      if (cb_value == (cn_cbor *)0x0) {
        if (perr == (cose_errback *)0x0) goto LAB_00180e50;
        cVar5 = _MapFromCBOR(cbor_error);
LAB_00180d68:
        cb_value = (cn_cbor *)0x0;
      }
      else {
        _Var2 = _COSE_array_replace(pSigner,cb_value,index,(cn_cbor_errback *)0x0);
        _Var6 = true;
        cb = (cn_cbor *)0x0;
        __ptr = (uint8_t *)0x0;
        if (_Var2) goto LAB_00180d8b;
        if (perr == (cose_errback *)0x0) {
          _Var6 = false;
          cb = cb_value;
          __ptr = buf;
          goto LAB_00180d8b;
        }
        cVar5 = COSE_ERR_CBOR;
      }
      goto LAB_00180c9b;
    }
    if (cbitDigest == 0x200) {
      mStack_240 = MBEDTLS_MD_SHA512;
      goto LAB_00180c59;
    }
    if (cbitDigest == 0x180) {
      mStack_240 = MBEDTLS_MD_SHA384;
      goto LAB_00180c59;
    }
LAB_00180c82:
    if (perr != (cose_errback *)0x0) goto LAB_00180c96;
LAB_00180d87:
    buf = (uint8_t *)0x0;
    cb_value = (cn_cbor *)0x0;
  }
LAB_00180d89:
  _Var6 = false;
  cb = cb_value;
  __ptr = buf;
LAB_00180d8b:
  cn_cbor_free(cb);
  free(__ptr);
  mbedtls_mpi_free(&r);
  mbedtls_mpi_free(&s);
  mbedtls_entropy_free(&entropy);
  mbedtls_ctr_drbg_free(&ctrDrbg);
  return _Var6;
}

Assistant:

bool ECDSA_Sign(COSE * pSigner, int index, const eckey_t * eckey, int cbitDigest, const byte * rgbToSign, size_t cbToSign, cose_errback * perr)
{
#if defined(MBEDTLS_ECDSA_DETERMINISTIC)
	byte rgbDigest[MBEDTLS_MD_MAX_SIZE];
	uint8_t * pbSig = NULL;
	cn_cbor_errback cbor_error;
	int cbR;
	mbedtls_md_type_t mdType;
	const mbedtls_md_info_t *pmdInfo;
    mbedtls_entropy_context  entropy;
	mbedtls_ctr_drbg_context ctrDrbg;
	mbedtls_mpi r;
	mbedtls_mpi s;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = &pSigner->m_allocContext;
#endif
	cn_cbor * p = NULL;
	bool result = false;

	mbedtls_entropy_init(&entropy);
    mbedtls_ctr_drbg_init(&ctrDrbg);
    mbedtls_ctr_drbg_seed(&ctrDrbg, mbedtls_entropy_func, &entropy, NULL, 0);
	mbedtls_mpi_init(&r);
	mbedtls_mpi_init(&s);

	CHECK_CONDITION(eckey->d.n != 0, COSE_ERR_INVALID_PARAMETER);

	switch(cbitDigest)
	{
	case 256:
		mdType = MBEDTLS_MD_SHA256;
		break;

	case 384:
		mdType = MBEDTLS_MD_SHA384;
		break;

	case 512:
		mdType = MBEDTLS_MD_SHA512;
		break;

	default:
		FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);
	}
	pmdInfo = mbedtls_md_info_from_type(mdType);
	CHECK_CONDITION(pmdInfo != NULL, COSE_ERR_INVALID_PARAMETER);
	CHECK_CONDITION(mbedtls_md(pmdInfo, rgbToSign, cbToSign, rgbDigest) == 0, COSE_ERR_INVALID_PARAMETER);

	CHECK_CONDITION(mbedtls_ecdsa_sign_det_ext((mbedtls_ecp_group*)&eckey->grp, &r, &s, &eckey->d, rgbDigest, mbedtls_md_get_size(pmdInfo), mdType, mbedtls_ctr_drbg_random, &ctrDrbg) == 0, COSE_ERR_CRYPTO_FAIL);

	cbR = (eckey->grp.nbits + 7) / 8;

	pbSig = COSE_CALLOC(cbR, 2, context);
	CHECK_CONDITION(pbSig != NULL, COSE_ERR_OUT_OF_MEMORY);

	CHECK_CONDITION(mbedtls_mpi_write_binary(&r, pbSig, cbR) == 0, COSE_ERR_INTERNAL);
	CHECK_CONDITION(mbedtls_mpi_write_binary(&s, pbSig + cbR, cbR) == 0, COSE_ERR_INTERNAL);

	p = cn_cbor_data_create(pbSig, cbR*2, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(p != NULL, cbor_error);

	CHECK_CONDITION(_COSE_array_replace(pSigner, p, index, CBOR_CONTEXT_PARAM_COMMA NULL), COSE_ERR_CBOR);

	p = NULL;
	pbSig = NULL;
	result = true;

errorReturn:
	cn_cbor_free(p CBOR_CONTEXT_PARAM);
	COSE_FREE(pbSig, context);
	mbedtls_mpi_free(&r);
	mbedtls_mpi_free(&s);
    mbedtls_entropy_free(&entropy);
	mbedtls_ctr_drbg_free(&ctrDrbg);
	return result;
#else
	return false;
#endif
}